

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

qpTestResult
glu::TextureTestUtil::compareGenMipmapResult
          (TestLog *log,Texture2D *resultTexture,Texture2D *level0Reference,
          GenMipmapPrecision *precision)

{
  int iVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  ConstPixelBufferAccess *result_00;
  MessageBuilder *pMVar4;
  TestLog *this;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  LogImage local_9f8;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  string local_938;
  LogImage local_918;
  string local_888;
  allocator<char> local_861;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  string local_800;
  allocator<char> local_7d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  LogImageSet local_798;
  MessageBuilder local_758;
  PixelBufferAccess local_5d8;
  int local_5ac;
  undefined1 local_5a8 [4];
  int numFailed_2;
  PixelBufferAccess local_428;
  int local_3fc;
  undefined1 local_3f8 [4];
  int numFailed_1;
  PixelBufferAccess local_278;
  int local_250;
  byte local_249;
  int numFailed;
  bool levelOk;
  Surface errorMask;
  ConstPixelBufferAccess dst;
  ConstPixelBufferAccess src;
  int levelNdx;
  MessageBuilder local_1d0;
  undefined1 local_4d;
  undefined1 local_4c [7];
  bool level0Ok;
  undefined1 local_3c [8];
  Vec4 threshold;
  qpTestResult result;
  GenMipmapPrecision *precision_local;
  Texture2D *level0Reference_local;
  Texture2D *resultTexture_local;
  TestLog *log_local;
  
  threshold.m_data[2] = 0.0;
  unique0x10000c24 = precision;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_4c,1.0);
  tcu::select<float,4>
            ((tcu *)local_3c,&precision->colorThreshold,(Vector<float,_4> *)local_4c,
             &stack0xffffffffffffffd8->colorMask);
  pCVar3 = tcu::TextureLevelPyramid::getLevel(&level0Reference->super_TextureLevelPyramid,0);
  result_00 = tcu::TextureLevelPyramid::getLevel(&resultTexture->super_TextureLevelPyramid,0);
  local_4d = tcu::floatThresholdCompare
                       (log,"Level0","Level 0",pCVar3,result_00,(Vec4 *)local_3c,COMPARE_LOG_RESULT)
  ;
  if (!(bool)local_4d) {
    tcu::TestLog::operator<<(&local_1d0,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1d0,(char (*) [34])"ERROR: Level 0 comparison failed!");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    threshold.m_data[2] = 1.4013e-45;
  }
  for (src.m_data._0_4_ = 1; iVar2 = (int)src.m_data,
      iVar1 = tcu::TextureLevelPyramid::getNumLevels(&resultTexture->super_TextureLevelPyramid),
      iVar2 < iVar1; src.m_data._0_4_ = (int)src.m_data + 1) {
    pCVar3 = tcu::TextureLevelPyramid::getLevel
                       (&resultTexture->super_TextureLevelPyramid,(int)src.m_data + -1);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&dst.m_data,pCVar3);
    pCVar3 = tcu::TextureLevelPyramid::getLevel
                       (&resultTexture->super_TextureLevelPyramid,(int)src.m_data);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,pCVar3);
    iVar2 = tcu::ConstPixelBufferAccess::getWidth
                      ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap);
    iVar1 = tcu::ConstPixelBufferAccess::getHeight
                      ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap);
    tcu::Surface::Surface((Surface *)&numFailed,iVar2,iVar1);
    local_249 = 0;
    tcu::Surface::getAccess(&local_278,(Surface *)&numFailed);
    local_250 = compareGenMipmapBilinear
                          ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,
                           (ConstPixelBufferAccess *)&dst.m_data,&local_278,stack0xffffffffffffffd8)
    ;
    if (local_250 == 0) {
      local_249 = 1;
    }
    else {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_3f8,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_3f8,(char (*) [16])"WARNING: Level ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&src.m_data);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [46])" comparison to bilinear method failed, found ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_250);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])0x2c2c257);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3f8);
    }
    if ((local_249 & 1) == 0) {
      tcu::Surface::getAccess(&local_428,(Surface *)&numFailed);
      local_3fc = compareGenMipmapBox((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,
                                      (ConstPixelBufferAccess *)&dst.m_data,&local_428,
                                      stack0xffffffffffffffd8);
      if (local_3fc == 0) {
        local_249 = 1;
      }
      else {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_5a8,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_5a8,(char (*) [16])"WARNING: Level ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&src.m_data);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [41])" comparison to box method failed, found ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_3fc);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])0x2c2c257);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_5a8);
      }
    }
    if (((local_249 & 1) == 0) && (threshold.m_data[2] == 0.0)) {
      threshold.m_data[2] = 2.8026e-45;
    }
    if ((local_249 & 1) == 0) {
      tcu::Surface::getAccess(&local_5d8,(Surface *)&numFailed);
      local_5ac = compareGenMipmapVeryLenient
                            ((ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,
                             (ConstPixelBufferAccess *)&dst.m_data,&local_5d8,
                             stack0xffffffffffffffd8);
      if (local_5ac == 0) {
        local_249 = 1;
      }
      else {
        tcu::TestLog::operator<<(&local_758,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<(&local_758,(char (*) [14])"ERROR: Level ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&src.m_data);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])" appears to contain ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_5ac);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [40])" completely wrong pixels, failing case!");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_758);
      }
    }
    if ((local_249 & 1) == 0) {
      threshold.m_data[2] = 1.4013e-45;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"Level",&local_7d9);
    de::toString<int>(&local_800,(int *)&src.m_data);
    std::operator+(&local_7b8,&local_7d8,&local_800);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"Level ",&local_861);
    de::toString<int>(&local_888,(int *)&src.m_data);
    std::operator+(&local_840,&local_860,&local_888);
    std::operator+(&local_820,&local_840," result");
    tcu::LogImageSet::LogImageSet(&local_798,&local_7b8,&local_820);
    this = tcu::TestLog::operator<<(log,&local_798);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"Result",&local_939);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"Result",&local_961);
    tcu::LogImage::LogImage
              (&local_918,&local_938,&local_960,(ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(this,&local_918);
    tcu::LogImage::~LogImage(&local_918);
    std::__cxx11::string::~string((string *)&local_960);
    std::allocator<char>::~allocator(&local_961);
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator(&local_939);
    tcu::LogImageSet::~LogImageSet(&local_798);
    std::__cxx11::string::~string((string *)&local_820);
    std::__cxx11::string::~string((string *)&local_840);
    std::__cxx11::string::~string((string *)&local_888);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator(&local_861);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::string::~string((string *)&local_800);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator(&local_7d9);
    if ((local_249 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a18,"ErrorMask",&local_a19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a40,"Error mask",&local_a41);
      tcu::LogImage::LogImage
                (&local_9f8,&local_a18,&local_a40,(Surface *)&numFailed,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::TestLog::operator<<(log,&local_9f8);
      tcu::LogImage::~LogImage(&local_9f8);
      std::__cxx11::string::~string((string *)&local_a40);
      std::allocator<char>::~allocator(&local_a41);
      std::__cxx11::string::~string((string *)&local_a18);
      std::allocator<char>::~allocator(&local_a19);
    }
    tcu::TestLog::operator<<(log,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::Surface::~Surface((Surface *)&numFailed);
  }
  return (qpTestResult)threshold.m_data[2];
}

Assistant:

qpTestResult compareGenMipmapResult (tcu::TestLog& log, const tcu::Texture2D& resultTexture, const tcu::Texture2D& level0Reference, const GenMipmapPrecision& precision)
{
	qpTestResult result = QP_TEST_RESULT_PASS;

	// Special comparison for level 0.
	{
		const tcu::Vec4		threshold	= select(precision.colorThreshold, tcu::Vec4(1.0f), precision.colorMask);
		const bool			level0Ok	= tcu::floatThresholdCompare(log, "Level0", "Level 0", level0Reference.getLevel(0), resultTexture.getLevel(0), threshold, tcu::COMPARE_LOG_RESULT);

		if (!level0Ok)
		{
			log << tcu::TestLog::Message << "ERROR: Level 0 comparison failed!" << tcu::TestLog::EndMessage;
			result = QP_TEST_RESULT_FAIL;
		}
	}

	for (int levelNdx = 1; levelNdx < resultTexture.getNumLevels(); levelNdx++)
	{
		const tcu::ConstPixelBufferAccess	src			= resultTexture.getLevel(levelNdx-1);
		const tcu::ConstPixelBufferAccess	dst			= resultTexture.getLevel(levelNdx);
		tcu::Surface						errorMask	(dst.getWidth(), dst.getHeight());
		bool								levelOk		= false;

		// Try different comparisons in quality order.

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapBilinear(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << " comparison to bilinear method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
		}

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapBox(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << " comparison to box method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
		}

		// At this point all high-quality methods have been used.
		if (!levelOk && result == QP_TEST_RESULT_PASS)
			result = QP_TEST_RESULT_QUALITY_WARNING;

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapVeryLenient(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "ERROR: Level " << levelNdx << " appears to contain " << numFailed << " completely wrong pixels, failing case!" << tcu::TestLog::EndMessage;
		}

		if (!levelOk)
			result = QP_TEST_RESULT_FAIL;

		log << tcu::TestLog::ImageSet(string("Level") + de::toString(levelNdx), string("Level ") + de::toString(levelNdx) + " result")
			<< tcu::TestLog::Image("Result", "Result", dst);

		if (!levelOk)
			log << tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);

		log << tcu::TestLog::EndImageSet;
	}

	return result;
}